

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  ostream *poVar1;
  string c;
  string p;
  long *local_48;
  long local_40;
  long local_38 [2];
  long *local_28 [2];
  long local_18 [2];
  
  if (argc == 2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_28,argv[1],(allocator<char> *)&local_48);
    R5R::Decrypt((string *)&local_48);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_48,local_40);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    if (local_48 != local_38) {
      operator_delete(local_48,local_38[0] + 1);
    }
    if (local_28[0] != local_18) {
      operator_delete(local_28[0],local_18[0] + 1);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Usage: r5r-dec <ciphertext>",0x1b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
  }
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc == 2)
    {
        string p = argv[1];
        string c = R5R::Decrypt(p);
        cout << c << endl;
    }
    else
    {
        cout << "Usage: r5r-dec <ciphertext>" << endl;
    }
    return 0;
}